

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.cpp
# Opt level: O3

vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *
handlegraph::algorithms::topological_order(HandleGraph *g)

{
  _Any_data *__dest;
  _Rb_tree_header *p_Var1;
  iterator __position;
  size_t sVar2;
  _Base_ptr p_Var3;
  size_type __n;
  mapped_type *pmVar4;
  long lVar5;
  _Base_ptr p_Var6;
  long *in_RSI;
  vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>> *in_RDI;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  handle_t *head;
  undefined8 *puVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  pVar10;
  handle_t first_seed;
  handle_t n;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  unvisited;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> heads;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  s;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  seeds;
  unordered_set<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>_>
  masked_edges;
  _Any_data local_170;
  HandleGraph *in_stack_fffffffffffffea0;
  undefined1 local_148 [8];
  handle_t *local_140;
  _Hashtable<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Identity,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_138;
  _Base_ptr local_130;
  _Base_ptr local_128;
  _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  *local_120;
  handle_t local_118;
  _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  local_110;
  undefined8 *local_e0;
  undefined8 *local_d8;
  long local_d0;
  _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  local_c8;
  _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  local_98;
  _Hashtable<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Identity,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  local_170._M_unused._M_object = in_RSI;
  __n = (**(code **)(*in_RSI + 0x48))();
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::reserve
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)in_RDI,__n);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  head_nodes(in_stack_fffffffffffffea0);
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_e0 != local_d8) {
    puVar9 = local_e0;
    do {
      local_110._M_impl._0_8_ =
           (**(code **)(*local_170._M_unused._M_object + 0x20))
                     (local_170._M_unused._M_object,puVar9);
      pmVar4 = std::
               map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
               ::operator[]((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                             *)&local_c8,(key_type *)&local_110);
      *(undefined8 *)pmVar4->data = *puVar9;
      puVar9 = puVar9 + 1;
    } while (puVar9 != local_d8);
  }
  local_110._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_110._M_impl.super__Rb_tree_header._M_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  __dest = (_Any_data *)(local_170._M_pod_data + 8);
  local_140 = (handle_t *)0x0;
  local_130 = (_Base_ptr)
              std::
              _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
              ::_M_invoke;
  local_138 = (_Hashtable<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Identity,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)std::
                 _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                 ::_M_manager;
  local_170._8_8_ = (_Base_ptr)&local_c8;
  local_148 = (undefined1  [8])__dest;
  local_110._M_impl.super__Rb_tree_header._M_header._M_right =
       local_110._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)(*local_170._M_unused._M_object + 0x98))
            (local_170._M_unused._M_object,(_Base_ptr)local_148,0);
  if (local_138 !=
      (_Hashtable<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Identity,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)0x0) {
    (*(code *)local_138)(local_148,local_148,3);
  }
  if (local_110._M_impl.super__Rb_tree_header._M_node_count != 0 ||
      local_c8._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (local_c8._M_impl.super__Rb_tree_header._M_node_count != 0) goto LAB_001514af;
    do {
      do {
        p_Var3 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
        if (local_98._M_impl.super__Rb_tree_header._M_node_count == 0) {
          pmVar4 = std::
                   map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                   ::operator[]((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                                 *)&local_c8,
                                (key_type *)
                                (local_110._M_impl.super__Rb_tree_header._M_header._M_left + 1));
          *(_Base_ptr *)pmVar4->data = p_Var3[1]._M_parent;
          pVar10 = std::
                   _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                   ::equal_range(&local_110,
                                 (key_type *)
                                 (local_110._M_impl.super__Rb_tree_header._M_header._M_left + 1));
          std::
          _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
          ::_M_erase_aux(&local_110,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node
                        );
          if (local_c8._M_impl.super__Rb_tree_header._M_node_count == 0) goto LAB_00151620;
          break;
        }
        local_148 = (undefined1  [8])
                    local_98._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
        lVar5 = (**(code **)(*local_170._M_unused._M_object + 0x20))
                          (local_170._M_unused._M_object,local_148);
        if (local_110._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var1 = &local_110._M_impl.super__Rb_tree_header;
          p_Var3 = local_110._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = &p_Var1->_M_header;
          do {
            p_Var7 = p_Var8;
            p_Var6 = p_Var3;
            sVar2 = *(size_t *)(p_Var6 + 1);
            p_Var8 = p_Var6;
            if ((long)sVar2 < lVar5) {
              p_Var8 = p_Var7;
            }
            p_Var3 = (&p_Var6->_M_left)[(long)sVar2 < lVar5];
          } while ((&p_Var6->_M_left)[(long)sVar2 < lVar5] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var8 != p_Var1) {
            if ((long)sVar2 < lVar5) {
              p_Var6 = p_Var7;
            }
            if ((long)*(size_t *)(p_Var6 + 1) <= lVar5) {
              local_170._8_8_ =
                   (**(code **)(*local_170._M_unused._M_object + 0x20))
                             (local_170._M_unused._M_object,local_148);
              pmVar4 = std::
                       map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                       ::operator[]((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                                     *)&local_c8,(key_type *)(local_170._M_pod_data + 8));
              *(undefined1 (*) [8])pmVar4->data = local_148;
              local_170._8_8_ =
                   (**(code **)(*local_170._M_unused._M_object + 0x20))
                             (local_170._M_unused._M_object,local_148);
              pVar10 = std::
                       _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                       ::equal_range(&local_110,(key_type *)(local_170._M_pod_data + 8));
              std::
              _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
              ::_M_erase_aux(&local_110,(_Base_ptr)pVar10.first._M_node,
                             (_Base_ptr)pVar10.second._M_node);
            }
          }
        }
        std::
        _Rb_tree<long_long,std::pair<long_long_const,handlegraph::handle_t>,std::_Select1st<std::pair<long_long_const,handlegraph::handle_t>>,std::less<long_long>,std::allocator<std::pair<long_long_const,handlegraph::handle_t>>>
        ::erase_abi_cxx11_((_Rb_tree<long_long,std::pair<long_long_const,handlegraph::handle_t>,std::_Select1st<std::pair<long_long_const,handlegraph::handle_t>>,std::less<long_long>,std::allocator<std::pair<long_long_const,handlegraph::handle_t>>>
                            *)&local_98,
                           (iterator)local_98._M_impl.super__Rb_tree_header._M_header._M_left);
      } while (local_c8._M_impl.super__Rb_tree_header._M_node_count == 0);
LAB_001514af:
      do {
        local_118.data =
             (char  [8])local_c8._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
        local_148 = (undefined1  [8])
                    (**(code **)(*local_170._M_unused._M_object + 0x20))
                              (local_170._M_unused._M_object,&local_118);
        pVar10 = std::
                 _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                 ::equal_range(&local_c8,(key_type *)local_148);
        std::
        _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
        ::_M_erase_aux(&local_c8,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
        __position._M_current = *(handle_t **)(in_RDI + 8);
        if (__position._M_current == *(handle_t **)(in_RDI + 0x10)) {
          std::vector<handlegraph::handle_t,std::allocator<handlegraph::handle_t>>::
          _M_realloc_insert<handlegraph::handle_t_const&>(in_RDI,__position,&local_118);
        }
        else {
          *&(__position._M_current)->data = local_118.data;
          *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 8;
        }
        local_170._8_8_ = &local_110;
        local_140 = (handle_t *)0x0;
        local_130 = (_Base_ptr)
                    std::
                    _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                    ::_M_invoke;
        local_138 = (_Hashtable<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Identity,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)std::
                       _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
                       ::_M_manager;
        local_148 = (undefined1  [8])__dest;
        (**(code **)(*local_170._M_unused._M_object + 0x90))
                  (local_170._M_unused._M_object,&local_118,1,(_Base_ptr)local_148);
        if (local_138 !=
            (_Hashtable<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Identity,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)0x0) {
          (*(code *)local_138)((_Base_ptr)local_148,(_Base_ptr)local_148,3);
        }
        local_148 = (undefined1  [8])&local_170;
        local_130 = (_Base_ptr)&local_110;
        local_120 = &local_98;
        local_170._8_8_ = (_Base_ptr)local_148;
        local_140 = &local_118;
        local_138 = &local_68;
        local_128 = (_Base_ptr)&local_c8;
        (**(code **)(*local_170._M_unused._M_object + 0x90))
                  (local_170._M_unused._M_object,&local_118,0,__dest);
        std::
        _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
        ::_M_manager(__dest,__dest,__destroy_functor);
      } while (local_c8._M_impl.super__Rb_tree_header._M_node_count != 0);
LAB_00151620:
    } while (local_110._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  ::~_Rb_tree(&local_110);
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  ::~_Rb_tree(&local_98);
  if (local_e0 != (undefined8 *)0x0) {
    operator_delete(local_e0,local_d0 - (long)local_e0);
  }
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_handlegraph::handle_t>,_std::_Select1st<std::pair<const_long_long,_handlegraph::handle_t>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  ::~_Rb_tree(&local_c8);
  std::
  _Hashtable<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Identity,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)in_RDI;
}

Assistant:

vector<handle_t> topological_order(const HandleGraph* g) {
    
    // Make a vector to hold the ordered and oriented nodes.
    vector<handle_t> sorted;
    sorted.reserve(g->get_node_count());
    
    // Instead of actually removing edges, we add them to this set of masked edges.
    unordered_set<pair<handle_t, handle_t>> masked_edges;
    
    // This (s) is our set of oriented nodes.
    // using a map instead of a set ensures a stable sort across different systems
    map<nid_t, handle_t> s;

    // We find the head and tails, if there are any
    vector<handle_t> heads{head_nodes(g)};
    // No need to fetch the tails since we don't use them

    
    // Maps from node ID to first orientation we suggested for it.
    map<nid_t, handle_t> seeds;
    
    
    for(handle_t& head : heads) {
        // Dump all the heads into the oriented set, rather than having them as
        // seeds. We will only go for cycle-breaking seeds when we run out of
        // heads. This is bad for contiguity/ordering consistency in cyclic
        // graphs and reversing graphs, but makes sure we work out to just
        // topological sort on DAGs. It mimics the effect we used to get when we
        // joined all the head nodes to a new root head node and seeded that. We
        // ignore tails since we only orient right from nodes we pick.
        s[g->get_id(head)] = head;
    }

    // We will use an ordered map handles by ID for nodes we have not visited
    // yet. This ensures a consistent sort order across systems.
    map<nid_t, handle_t> unvisited;
    g->for_each_handle([&](const handle_t& found) {
        if (!s.count(g->get_id(found))) {
            // Only nodes that aren't yet in s are unvisited.
            // Nodes in s are visited but just need to be added tot he ordering.
            unvisited.emplace(g->get_id(found), found);
        }
    });

    while(!unvisited.empty() || !s.empty()) {

        // Put something in s. First go through seeds until we can find one
        // that's not already oriented.
        while(s.empty() && !seeds.empty()) {
            // Look at the first seed
            auto first_seed = (*seeds.begin()).second;

            if(unvisited.count(g->get_id(first_seed))) {
                // We have an unvisited seed. Use it
#ifdef debug
                cerr << "Starting from seed " << g->get_id(first_seed) << " orientation " << g->get_is_reverse(first_seed) << endl;
#endif

                s[g->get_id(first_seed)] = first_seed;
                unvisited.erase(g->get_id(first_seed));
            }
            // Whether we used the seed or not, don't keep it around
            seeds.erase(seeds.begin());
        }

        if(s.empty()) {
            // If we couldn't find a seed, just grab any old node.
            // Since map order is stable across systems, we can take the first node by id and put it locally forward.
#ifdef debug
            cerr << "Starting from arbitrary node " << unvisited.begin()->first << " locally forward" << endl;
#endif

            s[unvisited.begin()->first] = unvisited.begin()->second;
            unvisited.erase(unvisited.begin()->first);
        }

        while (!s.empty()) {
            // Grab an oriented node
            auto n = s.begin()->second;
            s.erase(g->get_id(n));
            // Emit it
            sorted.push_back(n);
#ifdef debug
            cerr << "Using oriented node " << g->get_id(n) << " orientation " << g->get_is_reverse(n) << endl;
#endif

            // See if it has an edge from its start to the start of some node
            // where both were picked as places to break into cycles. A
            // reversing self loop on a cycle entry point is a special case of
            // this.
            g->follow_edges(n, true, [&](const handle_t& prev_node) {
                if(!unvisited.count(g->get_id(prev_node))) {
                    // Look at the edge
                    auto edge = g->edge_handle(prev_node, n);
                    if (masked_edges.count(edge)) {
                        // We removed this edge, so skip it.
                        return;
                    }
                    
#ifdef debug
                    cerr << "\tHas left-side edge to cycle entry point " << g->get_id(prev_node)
                         << " orientation " << g->get_is_reverse(prev_node) << endl;
#endif

                    // Mask the edge
                    masked_edges.insert(edge);
                    
#ifdef debug
                    cerr << "\t\tEdge: " << g->get_id(edge.first) << " " << g->get_is_reverse(edge.first)
                        << " -> " << g->get_id(edge.second) << " " << g->get_is_reverse(edge.second) << endl;
#endif
                }
            });

            // All other connections and self loops are handled by looking off the right side.

            // See what all comes next, minus deleted edges.
            g->follow_edges(n, false, [&](const handle_t& next_node) {

                // Look at the edge
                auto edge = g->edge_handle(n, next_node);
                if (masked_edges.count(edge)) {
                    // We removed this edge, so skip it.
                    return;
                }

#ifdef debug
                cerr << "\tHas edge to " << g->get_id(next_node) << " orientation " << g->get_is_reverse(next_node) << endl;
#endif

                // Mask the edge connecting these nodes in this order and
                // relative orientation, so we can't traverse it again

#ifdef debug
                cerr << "\t\tEdge: " << g->get_id(edge.first) << " " << g->get_is_reverse(edge.first)
                    << " -> " << g->get_id(edge.second) << " " << g->get_is_reverse(edge.second) << endl;
#endif

                // Mask the edge
                masked_edges.insert(edge);

                if(unvisited.count(g->get_id(next_node))) {
                    // We haven't already started here as an arbitrary cycle entry point

#ifdef debug
                    cerr << "\t\tAnd node hasn't been visited yet" << endl;
#endif

                    bool unmasked_incoming_edge = false;
                    g->follow_edges(next_node, true, [&](const handle_t& prev_node) {
                        // Get a handle for each incoming edge
                        auto prev_edge = g->edge_handle(prev_node, next_node);
                        
                        if (!masked_edges.count(prev_edge)) {
                            // We found such an edghe and can stop looking
                            unmasked_incoming_edge = true;
                            return false;
                        }
                        // Otherwise check all the edges on the left of this handle
                        return true;
                    });

                    if(!unmasked_incoming_edge) {

#ifdef debug
                        cerr << "\t\t\tIs last incoming edge" << endl;
#endif
                        // Keep this orientation and put it here
                        s[g->get_id(next_node)] = next_node;
                        // Remember that we've visited and oriented this node, so we
                        // don't need to use it as a seed.
                        unvisited.erase(g->get_id(next_node));

                    } else if(!seeds.count(g->get_id(next_node))) {
                        // We came to this node in this orientation; when we need a
                        // new node and orientation to start from (i.e. an entry
                        // point to the node's cycle), we might as well pick this
                        // one.
                        // Only take it if we don't already know of an orientation for this node.
                        seeds[g->get_id(next_node)] = next_node;

#ifdef debug
                        cerr << "\t\t\tSuggests seed " << g->get_id(next_node) << " orientation " << g->get_is_reverse(next_node) << endl;
#endif
                    }
                } else {
#ifdef debug
                    cerr << "\t\tAnd node was already visited (to break a cycle)" << endl;
#endif
                }
            });
        }
    }

    // Send away our sorted ordering.
    return sorted;
}